

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

clock_t __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<true>_>::clock
          (fm_engine_base<ymfm::opn_registers_base<true>_> *this)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  pointer pfVar4;
  uint32_t in_ESI;
  uint local_20;
  uint32_t chnum_1;
  int32_t lfo_raw_pm;
  uint32_t chnum;
  uint32_t chanmask_local;
  fm_engine_base<ymfm::opn_registers_base<true>_>_conflict *this_local;
  
  this->m_total_clocks = this->m_total_clocks + '\x01';
  if ((this->m_modified_channels != 0) ||
     (uVar1 = this->m_prepare_count, this->m_prepare_count = uVar1 + 1, 0xfff < uVar1)) {
    this->m_active_channels = 0;
    for (chnum_1 = 0; chnum_1 < 6; chnum_1 = chnum_1 + 1) {
      uVar3 = bitfield(in_ESI,chnum_1,1);
      if (uVar3 != 0) {
        pfVar4 = std::
                 unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                 ::operator->(this->m_channel + chnum_1);
        bVar2 = fm_channel<ymfm::opn_registers_base<true>_>::prepare(pfVar4);
        if (bVar2) {
          this->m_active_channels = 1 << ((byte)chnum_1 & 0x1f) | this->m_active_channels;
        }
      }
    }
    this->m_prepare_count = 0;
    this->m_modified_channels = 0;
  }
  uVar3 = this->m_env_counter + 1;
  this->m_env_counter = uVar3;
  uVar3 = bitfield(uVar3,0,2);
  if (uVar3 == 3) {
    this->m_env_counter = this->m_env_counter + 1;
  }
  opn_registers_base<true>::clock_noise_and_lfo(&this->m_regs);
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    uVar3 = bitfield(in_ESI,local_20,1);
    if (uVar3 != 0) {
      pfVar4 = std::
               unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
               ::operator->(this->m_channel + local_20);
      fm_channel<ymfm::opn_registers_base<true>_>::clock(pfVar4);
    }
  }
  return (ulong)this->m_env_counter;
}

Assistant:

uint32_t fm_engine_base<RegisterType>::clock(uint32_t chanmask)
{
	// update the clock counter
	m_total_clocks++;

	// if something was modified, prepare
	// also prepare every 4k samples to catch ending notes
	if (m_modified_channels != 0 || m_prepare_count++ >= 4096)
	{
		// reassign operators to channels if dynamic
		if (RegisterType::DYNAMIC_OPS)
			assign_operators();

		// call each channel to prepare
		m_active_channels = 0;
		for (uint32_t chnum = 0; chnum < CHANNELS; chnum++)
			if (bitfield(chanmask, chnum))
				if (m_channel[chnum]->prepare())
					m_active_channels |= 1 << chnum;

		// reset the modified channels and prepare count
		m_modified_channels = m_prepare_count = 0;
	}

	// if the envelope clock divider is 1, just increment by 4;
	// otherwise, increment by 1 and manually wrap when we reach the divide count
	if (RegisterType::EG_CLOCK_DIVIDER == 1)
		m_env_counter += 4;
	else if (bitfield(++m_env_counter, 0, 2) == RegisterType::EG_CLOCK_DIVIDER)
		m_env_counter += 4 - RegisterType::EG_CLOCK_DIVIDER;

	// clock the noise generator
	int32_t lfo_raw_pm = m_regs.clock_noise_and_lfo();

	// now update the state of all the channels and operators
	for (uint32_t chnum = 0; chnum < CHANNELS; chnum++)
		if (bitfield(chanmask, chnum))
			m_channel[chnum]->clock(m_env_counter, lfo_raw_pm);

	// return the envelope counter as it is used to clock ADPCM-A
	return m_env_counter;
}